

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

void __thiscall cmFindBase::FillPackageRootPath(cmFindBase *this)

{
  cmMakefile *pcVar1;
  _Elt_pointer pvVar2;
  mapped_type *this_00;
  _Map_pointer ppvVar3;
  _Map_pointer ppvVar4;
  _Elt_pointer pvVar5;
  _Elt_pointer pvVar6;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::PackageRoot);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  pvVar2 = (pcVar1->FindPackageRootPathStack).
           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pvVar5 = (pcVar1->FindPackageRootPathStack).
           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar5 != pvVar2) {
    pvVar6 = (pcVar1->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppvVar3 = (pcVar1->FindPackageRootPathStack).
              super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    do {
      if (pvVar5 == pvVar6) {
        ppvVar4 = ppvVar3 + -1;
        cmSearchPath::AddPrefixPaths(this_00,ppvVar3[-1] + 0x14,(char *)0x0);
        pvVar6 = ppvVar3[-1];
        pvVar5 = pvVar6 + 0x15;
      }
      else {
        cmSearchPath::AddPrefixPaths(this_00,pvVar5 + -1,(char *)0x0);
        ppvVar4 = ppvVar3;
      }
      pvVar5 = pvVar5 + -1;
      ppvVar3 = ppvVar4;
    } while (pvVar5 != pvVar2);
  }
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  return;
}

Assistant:

void cmFindBase::FillPackageRootPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::PackageRoot];

  // Add the PACKAGE_ROOT_PATH from each enclosing find_package call.
  for (std::vector<std::string> const& pkgPaths :
       cmReverseRange(this->Makefile->FindPackageRootPathStack)) {
    paths.AddPrefixPaths(pkgPaths);
  }

  paths.AddSuffixes(this->SearchPathSuffixes);
}